

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall wallet::LegacyDataSPKM::GetPubKey(LegacyDataSPKM *this)

{
  CPubKey *in_RDX;
  CKeyID *in_RSI;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    GetPubKey((LegacyDataSPKM *)
              &this[-1].set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
              ,in_RSI,in_RDX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetPubKey(const CKeyID &address, CPubKey& vchPubKeyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        if (!FillableSigningProvider::GetPubKey(address, vchPubKeyOut)) {
            return GetWatchPubKey(address, vchPubKeyOut);
        }
        return true;
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        vchPubKeyOut = (*mi).second.first;
        return true;
    }
    // Check for watch-only pubkeys
    return GetWatchPubKey(address, vchPubKeyOut);
}